

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O3

int get_av1config_from_obu(uint8_t *buffer,size_t length,int is_annexb,Av1Config *config)

{
  int bits;
  void *pvVar1;
  aom_codec_err_t aVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint8_t uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  int result;
  size_t obu_header_length;
  size_t sequence_header_length;
  ObuHeader obu_header;
  int local_b0;
  int local_ac;
  aom_read_bit_buffer local_a8;
  int local_80;
  int local_7c;
  uint local_78;
  uint local_74;
  Av1Config *local_70;
  size_t local_68;
  size_t local_60;
  ObuHeader local_58;
  
  if (config == (Av1Config *)0x0 || (length == 0 || buffer == (uint8_t *)0x0)) {
    return -1;
  }
  local_58.has_extension = 0;
  local_58.temporal_layer_id = 0;
  local_58.spatial_layer_id = 0;
  local_58._28_4_ = 0;
  local_58.size = 0;
  local_58.type = 0;
  local_58._9_3_ = 0;
  local_58.has_size_field = 0;
  local_60 = 0;
  local_68 = 0;
  aVar2 = aom_read_obu_header_and_size(buffer,length,is_annexb,&local_58,&local_60,&local_68);
  if (aVar2 != AOM_CODEC_OK) {
    return -1;
  }
  if (local_58.type != OBU_SEQUENCE_HEADER) {
    return -1;
  }
  if (length < local_68 + local_60) {
    return -1;
  }
  config->chroma_subsampling_y = '\0';
  config->chroma_sample_position = '\0';
  config->initial_presentation_delay_present = '\0';
  config->initial_presentation_delay_minus_one = '\0';
  config->seq_profile = '\0';
  config->seq_level_idx_0 = '\0';
  config->seq_tier_0 = '\0';
  config->high_bitdepth = '\0';
  config->twelve_bit = '\0';
  config->monochrome = '\0';
  config->chroma_subsampling_x = '\0';
  config->chroma_subsampling_y = '\0';
  config->marker = '\x01';
  config->version = '\x01';
  local_a8.bit_buffer = buffer + local_68;
  local_a8.error_handler_data = &local_b0;
  local_b0 = 0;
  local_a8.bit_buffer_end = local_a8.bit_buffer + local_60;
  local_a8.bit_offset = 0;
  local_a8.error_handler = bitreader_error_handler;
  uVar3 = aom_rb_read_literal(&local_a8,3);
  if (local_b0 == -1) {
    pcVar10 = "av1c: Could not read bits for seq_profile, value=%d result=%d.\n";
  }
  else {
    config->seq_profile = (uint8_t)uVar3;
    uVar3 = aom_rb_read_bit(&local_a8);
    if (local_b0 == -1) {
      pcVar10 = "av1c: Error reading bit for still_picture, value=%d result=%d.\n";
    }
    else {
      uVar3 = aom_rb_read_bit(&local_a8);
      if (local_b0 == -1) {
        pcVar10 = "av1c: Error reading bit for reduced_still_picture_header, value=%d result=%d.\n";
LAB_0011fcd7:
        uVar8 = (ulong)uVar3;
        goto LAB_0012024a;
      }
      local_78 = uVar3;
      if (uVar3 == 0) {
        uVar6 = aom_rb_read_bit(&local_a8);
        pvVar1 = local_a8.error_handler_data;
        uVar8 = (ulong)uVar6;
        if (local_b0 == -1) {
          pcVar10 = "av1c: Error reading bit for timing_info_present_flag, value=%d result=%d.\n";
          goto LAB_0012024a;
        }
        local_80 = 0;
        if (uVar6 == 0) goto LAB_0011f82b;
        local_ac = 0;
        local_a8.error_handler_data = &local_ac;
        uVar3 = aom_rb_read_literal(&local_a8,0x20);
        if (local_ac == -1) {
          pcVar10 = "av1c: Could not read bits for num_units_in_display_tick, value=%d result=%d.\n"
          ;
LAB_0011ff04:
          fprintf(_stderr,pcVar10,(ulong)uVar3,0xffffffff);
          return -1;
        }
        uVar3 = aom_rb_read_literal(&local_a8,0x20);
        if (local_ac == -1) {
          pcVar10 = "av1c: Could not read bits for time_scale, value=%d result=%d.\n";
          goto LAB_0011ff04;
        }
        uVar3 = aom_rb_read_bit(&local_a8);
        if (local_ac == -1) {
          pcVar10 = "av1c: Error reading bit for equal_picture_interval, value=%d result=%d.\n";
          goto LAB_0011ff04;
        }
        if ((uVar3 != 0) && (uVar5 = aom_rb_read_uvlc(&local_a8), local_ac == -1)) {
          fprintf(_stderr,"av1c: Could not read bits for num_ticks_per_picture_minus_1, value=%u.\n"
                  ,(ulong)uVar5);
          pvVar1 = local_a8.error_handler_data;
        }
        local_a8.error_handler_data = pvVar1;
        if (local_ac != 0) {
          return -1;
        }
        uVar3 = aom_rb_read_bit(&local_a8);
        pvVar1 = local_a8.error_handler_data;
        if (local_b0 == -1) {
          pcVar10 = 
          "av1c: Error reading bit for decoder_model_info_present_flag, value=%d result=%d.\n";
        }
        else {
          local_a8.error_handler_data = pvVar1;
          if (uVar3 == 0) {
LAB_0011f82b:
            uVar3 = aom_rb_read_bit(&local_a8);
            if (local_b0 != -1) {
              config->initial_presentation_delay_present = (uint8_t)uVar3;
              uVar3 = aom_rb_read_literal(&local_a8,5);
              if (local_b0 == -1) {
                pcVar10 = 
                "av1c: Could not read bits for operating_points_cnt_minus_1, value=%d result=%d.\n";
                uVar8 = (ulong)uVar3;
                goto LAB_0012024a;
              }
              if (-1 < (int)uVar3) {
                local_80 = local_80 + 1;
                iVar11 = uVar3 + 1;
                iVar12 = 0;
                local_7c = iVar11;
                local_70 = config;
                do {
                  uVar3 = aom_rb_read_literal(&local_a8,0xc);
                  if (local_b0 == -1) {
                    pcVar10 = 
                    "av1c: Could not read bits for operating_point_idc, value=%d result=%d.\n";
                    goto LAB_00120248;
                  }
                  uVar4 = aom_rb_read_literal(&local_a8,5);
                  if (local_b0 == -1) {
                    pcVar10 = "av1c: Could not read bits for seq_level_idx, value=%d result=%d.\n";
                    goto LAB_0011fd10;
                  }
                  uVar3 = 0;
                  if ((7 < (int)uVar4) && (uVar3 = aom_rb_read_bit(&local_a8), local_b0 == -1)) {
                    pcVar10 = "av1c: Error reading bit for seq_tier_this_op, value=%d result=%d.\n";
                    goto LAB_0011fcd7;
                  }
                  pvVar1 = local_a8.error_handler_data;
                  local_74 = uVar3;
                  if (uVar6 != 0) {
                    uVar3 = aom_rb_read_bit(&local_a8);
                    bits = local_80;
                    pvVar1 = local_a8.error_handler_data;
                    if (local_b0 == -1) {
                      pcVar10 = 
                      "av1c: Error reading bit for decoder_model_present_for_op, value=%d result=%d.\n"
                      ;
                      goto LAB_00120248;
                    }
                    if (uVar3 != 0) {
                      local_ac = 0;
                      local_a8.error_handler_data = &local_ac;
                      uVar3 = aom_rb_read_literal(&local_a8,local_80);
                      if (local_ac == -1) {
                        pcVar10 = 
                        "av1c: Could not read bits for decoder_buffer_delay, value=%d result=%d.\n";
                        goto LAB_0011ff04;
                      }
                      uVar3 = aom_rb_read_literal(&local_a8,bits);
                      if (local_ac == -1) {
                        pcVar10 = 
                        "av1c: Could not read bits for encoder_buffer_delay, value=%d result=%d.\n";
                        goto LAB_0011ff04;
                      }
                      uVar3 = aom_rb_read_bit(&local_a8);
                      config = local_70;
                      iVar11 = local_7c;
                      if (local_ac == -1) {
                        pcVar10 = 
                        "av1c: Error reading bit for low_delay_mode_flag, value=%d result=%d.\n";
                        goto LAB_0011ff04;
                      }
                    }
                  }
                  local_a8.error_handler_data = pvVar1;
                  if (config->initial_presentation_delay_present != '\0') {
                    uVar3 = aom_rb_read_bit(&local_a8);
                    if (local_b0 == -1) {
                      pcVar10 = 
                      "av1c: Error reading bit for initial_presentation_delay_present_for_this_op, value=%d result=%d.\n"
                      ;
                      goto LAB_00120248;
                    }
                    if ((uVar3 != 0) && (uVar3 = aom_rb_read_literal(&local_a8,4), local_b0 == -1))
                    {
                      pcVar10 = 
                      "av1c: Could not read bits for initial_presentation_delay_minus_1, value=%d result=%d.\n"
                      ;
                      goto LAB_00120248;
                    }
                  }
                  if (iVar12 == 0) {
                    config->seq_level_idx_0 = (uint8_t)uVar4;
                    config->seq_tier_0 = (uint8_t)local_74;
                    config->initial_presentation_delay_present = '\0';
                    config->initial_presentation_delay_minus_one = '\0';
                  }
                  iVar12 = iVar12 + 1;
                } while (iVar11 != iVar12);
              }
              goto LAB_0011f532;
            }
            pcVar10 = 
            "av1c: Error reading bit for initial_presentation_delay_present, value=%d result=%d.\n";
          }
          else {
            local_ac = 0;
            local_a8.error_handler_data = &local_ac;
            uVar4 = aom_rb_read_literal(&local_a8,5);
            uVar8 = (ulong)uVar4;
            if (local_ac == -1) {
              pcVar10 = 
              "av1c: Could not read bits for buffer_delay_length_minus_1, value=%d result=%d.\n";
              goto LAB_0012024a;
            }
            uVar3 = aom_rb_read_literal(&local_a8,0x20);
            if (local_ac == -1) {
              pcVar10 = 
              "av1c: Could not read bits for num_units_in_decoding_tick, value=%d result=%d.\n";
            }
            else {
              uVar3 = aom_rb_read_literal(&local_a8,5);
              if (local_ac == -1) {
                pcVar10 = 
                "av1c: Could not read bits for buffer_removal_time_length_minus_1, value=%d result=%d.\n"
                ;
              }
              else {
                uVar3 = aom_rb_read_literal(&local_a8,5);
                if (local_ac != -1) {
                  local_80 = uVar4 + 1;
                  local_a8.error_handler_data = pvVar1;
                  if (local_80 == -1) {
                    return -1;
                  }
                  goto LAB_0011f82b;
                }
                pcVar10 = 
                "av1c: Could not read bits for frame_presentation_time_length_minus_1, value=%d result=%d.\n"
                ;
              }
            }
          }
        }
      }
      else {
        config->initial_presentation_delay_present = '\0';
        uVar3 = aom_rb_read_literal(&local_a8,5);
        if (local_b0 == -1) {
          pcVar10 = "av1c: Could not read bits for seq_level_idx_0, value=%d result=%d.\n";
        }
        else {
          config->seq_level_idx_0 = (uint8_t)uVar3;
          config->seq_tier_0 = '\0';
LAB_0011f532:
          uVar3 = aom_rb_read_literal(&local_a8,4);
          if (local_b0 == -1) {
            pcVar10 = 
            "av1c: Could not read bits for frame_width_bits_minus_1, value=%d result=%d.\n";
            uVar8 = (ulong)uVar3;
            goto LAB_0012024a;
          }
          uVar4 = aom_rb_read_literal(&local_a8,4);
          if (local_b0 == -1) {
            pcVar10 = 
            "av1c: Could not read bits for frame_height_bits_minus_1, value=%d result=%d.\n";
LAB_0011fd10:
            uVar8 = (ulong)uVar4;
            goto LAB_0012024a;
          }
          uVar3 = aom_rb_read_literal(&local_a8,uVar3 + 1);
          if (local_b0 == -1) {
            pcVar10 = "av1c: Could not read bits for max_frame_width_minus_1, value=%d result=%d.\n"
            ;
          }
          else {
            uVar3 = aom_rb_read_literal(&local_a8,uVar4 + 1);
            uVar6 = local_78;
            if (local_b0 == -1) {
              pcVar10 = 
              "av1c: Could not read bits for max_frame_height_minus_1, value=%d result=%d.\n";
            }
            else if (local_78 == 0) {
              uVar3 = aom_rb_read_bit(&local_a8);
              if (local_b0 == -1) {
                pcVar10 = 
                "av1c: Error reading bit for frame_id_numbers_present_flag, value=%d result=%d.\n";
              }
              else {
                if ((char)uVar3 == '\0') goto LAB_0011f5f7;
                uVar3 = aom_rb_read_literal(&local_a8,4);
                if (local_b0 == -1) {
                  pcVar10 = 
                  "av1c: Could not read bits for delta_frame_id_length_minus_2, value=%d result=%d.\n"
                  ;
                }
                else {
                  uVar3 = aom_rb_read_literal(&local_a8,3);
                  if (local_b0 != -1) goto LAB_0011f5f7;
                  pcVar10 = 
                  "av1c: Could not read bits for additional_frame_id_length_minus_1, value=%d result=%d.\n"
                  ;
                }
              }
            }
            else {
LAB_0011f5f7:
              uVar3 = aom_rb_read_bit(&local_a8);
              if (local_b0 == -1) {
                pcVar10 = 
                "av1c: Error reading bit for use_128x128_superblock, value=%d result=%d.\n";
              }
              else {
                uVar3 = aom_rb_read_bit(&local_a8);
                if (local_b0 == -1) {
                  pcVar10 = "av1c: Error reading bit for enable_filter_intra, value=%d result=%d.\n"
                  ;
                }
                else {
                  uVar3 = aom_rb_read_bit(&local_a8);
                  if (local_b0 == -1) {
                    pcVar10 = 
                    "av1c: Error reading bit for enable_intra_edge_filter, value=%d result=%d.\n";
                  }
                  else if (uVar6 == 0) {
                    uVar3 = aom_rb_read_bit(&local_a8);
                    if (local_b0 == -1) {
                      pcVar10 = 
                      "av1c: Error reading bit for enable_interintra_compound, value=%d result=%d.\n"
                      ;
                    }
                    else {
                      uVar3 = aom_rb_read_bit(&local_a8);
                      if (local_b0 == -1) {
                        pcVar10 = 
                        "av1c: Error reading bit for enable_masked_compound, value=%d result=%d.\n";
                      }
                      else {
                        uVar3 = aom_rb_read_bit(&local_a8);
                        if (local_b0 == -1) {
                          pcVar10 = 
                          "av1c: Error reading bit for enable_warped_motion, value=%d result=%d.\n";
                        }
                        else {
                          uVar3 = aom_rb_read_bit(&local_a8);
                          if (local_b0 == -1) {
                            pcVar10 = 
                            "av1c: Error reading bit for enable_dual_filter, value=%d result=%d.\n";
                          }
                          else {
                            uVar4 = aom_rb_read_bit(&local_a8);
                            if (local_b0 == -1) {
                              pcVar10 = 
                              "av1c: Error reading bit for enable_order_hint, value=%d result=%d.\n"
                              ;
                              goto LAB_0011fd10;
                            }
                            if (uVar4 == 0) {
LAB_0011fa65:
                              uVar3 = aom_rb_read_bit(&local_a8);
                              if (local_b0 == -1) {
                                pcVar10 = 
                                "av1c: Error reading bit for seq_choose_screen_content_tools, value=%d result=%d.\n"
                                ;
                              }
                              else if (uVar3 == 0) {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_b0 == -1) {
                                  pcVar10 = 
                                  "av1c: Error reading bit for seq_force_screen_content_tools_val, value=%d result=%d.\n"
                                  ;
                                }
                                else {
                                  if (0 < (int)uVar3) goto LAB_0011fa97;
LAB_0011fac5:
                                  if ((uVar4 == 0) ||
                                     (uVar3 = aom_rb_read_literal(&local_a8,3), local_b0 != -1))
                                  goto LAB_0011f63e;
                                  pcVar10 = 
                                  "av1c: Could not read bits for order_hint_bits_minus_1, value=%d result=%d.\n"
                                  ;
                                }
                              }
                              else {
LAB_0011fa97:
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_b0 == -1) {
                                  pcVar10 = 
                                  "av1c: Error reading bit for seq_choose_integer_mv, value=%d result=%d.\n"
                                  ;
                                }
                                else {
                                  if ((uVar3 != 0) ||
                                     (uVar3 = aom_rb_read_bit(&local_a8), local_b0 != -1))
                                  goto LAB_0011fac5;
                                  pcVar10 = 
                                  "av1c: Error reading bit for seq_force_integer_mv, value=%d result=%d.\n"
                                  ;
                                }
                              }
                            }
                            else {
                              uVar3 = aom_rb_read_bit(&local_a8);
                              if (local_b0 == -1) {
                                pcVar10 = 
                                "av1c: Error reading bit for enable_dist_wtd_comp, value=%d result=%d.\n"
                                ;
                              }
                              else {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_b0 != -1) goto LAB_0011fa65;
                                pcVar10 = 
                                "av1c: Error reading bit for enable_ref_frame_mvs, value=%d result=%d.\n"
                                ;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
LAB_0011f63e:
                    uVar3 = aom_rb_read_bit(&local_a8);
                    if (local_b0 == -1) {
                      pcVar10 = "av1c: Error reading bit for enable_superres, value=%d result=%d.\n"
                      ;
                    }
                    else {
                      uVar3 = aom_rb_read_bit(&local_a8);
                      if (local_b0 == -1) {
                        pcVar10 = "av1c: Error reading bit for enable_cdef, value=%d result=%d.\n";
                      }
                      else {
                        uVar3 = aom_rb_read_bit(&local_a8);
                        pvVar1 = local_a8.error_handler_data;
                        if (local_b0 != -1) {
                          local_a8.error_handler_data = &local_ac;
                          local_ac = 0;
                          uVar3 = aom_rb_read_bit(&local_a8);
                          if (local_ac == -1) {
                            pcVar10 = 
                            "av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n";
LAB_001200c1:
                            uVar8 = (ulong)uVar3;
                          }
                          else {
                            config->high_bitdepth = (uint8_t)uVar3;
                            uVar7 = config->seq_profile;
                            if ((uint8_t)uVar3 == '\0' || uVar7 != '\x02') {
                              bVar13 = false;
                            }
                            else {
                              uVar3 = aom_rb_read_bit(&local_a8);
                              if (local_ac == -1) {
                                pcVar10 = 
                                "av1c: Error reading bit for twelve_bit, value=%d result=%d.\n";
                                goto LAB_001200c1;
                              }
                              config->twelve_bit = (uint8_t)uVar3;
                              bVar13 = (uint8_t)uVar3 != '\0';
                              uVar7 = config->seq_profile;
                            }
                            if (uVar7 != '\x01') {
                              uVar3 = aom_rb_read_bit(&local_a8);
                              if (local_ac == -1) {
                                pcVar10 = 
                                "av1c: Error reading bit for mono_chrome, value=%d result=%d.\n";
                                goto LAB_001200c1;
                              }
                              config->monochrome = (uint8_t)uVar3;
                            }
                            uVar3 = aom_rb_read_bit(&local_a8);
                            if (local_ac == -1) {
                              pcVar10 = 
                              "av1c: Error reading bit for color_description_present_flag, value=%d result=%d.\n"
                              ;
                              goto LAB_001200c1;
                            }
                            if (uVar3 == 0) {
                              uVar6 = 2;
                              uVar4 = 2;
                              uVar3 = 2;
LAB_0011fbce:
                              if (config->monochrome == '\0') {
                                if ((uVar4 == 0xd && uVar6 == 1) && uVar3 == 0) {
LAB_0011fc33:
                                  config->chroma_subsampling_x = '\0';
                                  goto LAB_0011fc37;
                                }
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) goto LAB_0011ff17;
                                if (config->seq_profile == '\0') {
                                  config->chroma_subsampling_x = '\x01';
                                  config->chroma_subsampling_y = '\x01';
LAB_0011fe33:
                                  uVar3 = aom_rb_read_literal(&local_a8,2);
                                  if (local_ac != -1) {
                                    lVar9 = 10;
                                    goto LAB_0011fc3e;
                                  }
                                  pcVar10 = 
                                  "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n"
                                  ;
                                  goto LAB_001200c1;
                                }
                                if (config->seq_profile == '\x01') goto LAB_0011fc33;
                                if (!bVar13) {
                                  config->chroma_subsampling_x = '\x01';
LAB_0011fc37:
                                  lVar9 = 9;
                                  uVar3 = 0;
                                  goto LAB_0011fc3e;
                                }
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
                                  pcVar10 = 
                                  "av1c: Error reading bit for subsampling_x, value=%d result=%d.\n"
                                  ;
                                  goto LAB_001200c1;
                                }
                                config->chroma_subsampling_x = (uint8_t)uVar3;
                                if (uVar3 == 0) goto LAB_0011fc37;
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
                                  pcVar10 = 
                                  "av1c: Error reading bit for subsampling_y, value=%d result=%d.\n"
                                  ;
                                  goto LAB_001200c1;
                                }
                                config->chroma_subsampling_y = (uint8_t)uVar3;
                                if (config->chroma_subsampling_x != '\0' && (uint8_t)uVar3 != '\0')
                                goto LAB_0011fe33;
                              }
                              else {
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
LAB_0011ff17:
                                  pcVar10 = 
                                  "av1c: Error reading bit for color_range, value=%d result=%d.\n";
                                  goto LAB_001200c1;
                                }
                                config->chroma_subsampling_x = '\x01';
                                uVar3 = 1;
                                lVar9 = 9;
LAB_0011fc3e:
                                (&config->marker)[lVar9] = (uint8_t)uVar3;
                              }
                              if ((config->monochrome != '\0') ||
                                 (uVar3 = aom_rb_read_bit(&local_a8), local_ac != -1)) {
                                local_a8.error_handler_data = pvVar1;
                                if (local_ac != 0) goto LAB_001200cf;
                                uVar3 = aom_rb_read_bit(&local_a8);
                                if (local_b0 != -1) {
                                  return 0;
                                }
                                pcVar10 = 
                                "av1c: Error reading bit for film_grain_params_present, value=%d result=%d.\n"
                                ;
                                goto LAB_00120248;
                              }
                              pcVar10 = 
                              "av1c: Error reading bit for separate_uv_delta_q, value=%d result=%d.\n"
                              ;
                              goto LAB_001200c1;
                            }
                            uVar6 = aom_rb_read_literal(&local_a8,8);
                            if (local_ac == -1) {
                              pcVar10 = 
                              "av1c: Could not read bits for color_primaries_val, value=%d result=%d.\n"
                              ;
                              uVar8 = (ulong)uVar6;
                            }
                            else {
                              uVar4 = aom_rb_read_literal(&local_a8,8);
                              if (local_ac != -1) {
                                uVar3 = aom_rb_read_literal(&local_a8,8);
                                if (local_ac == -1) {
                                  pcVar10 = 
                                  "av1c: Could not read bits for matrix_coefficients_val, value=%d result=%d.\n"
                                  ;
                                  goto LAB_001200c1;
                                }
                                goto LAB_0011fbce;
                              }
                              pcVar10 = 
                              "av1c: Could not read bits for transfer_characteristics_val, value=%d result=%d.\n"
                              ;
                              uVar8 = (ulong)uVar4;
                            }
                          }
                          fprintf(_stderr,pcVar10,uVar8,0xffffffff);
LAB_001200cf:
                          get_av1config_from_obu_cold_1();
                          return -1;
                        }
                        pcVar10 = 
                        "av1c: Error reading bit for enable_restoration, value=%d result=%d.\n";
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00120248:
  uVar8 = (ulong)uVar3;
LAB_0012024a:
  fprintf(_stderr,pcVar10,uVar8,0xffffffff);
  return -1;
}

Assistant:

int get_av1config_from_obu(const uint8_t *buffer, size_t length, int is_annexb,
                           Av1Config *config) {
  if (!buffer || length == 0 || !config) {
    return -1;
  }

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));

  size_t sequence_header_length = 0;
  size_t obu_header_length = 0;
  if (aom_read_obu_header_and_size(buffer, length, is_annexb, &obu_header,
                                   &sequence_header_length,
                                   &obu_header_length) != AOM_CODEC_OK ||
      obu_header.type != OBU_SEQUENCE_HEADER ||
      sequence_header_length + obu_header_length > length) {
    return -1;
  }

  memset(config, 0, sizeof(*config));
  config->marker = 1;
  config->version = 1;
  return parse_sequence_header(buffer + obu_header_length,
                               sequence_header_length, config);
}